

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_lifo.h
# Opt level: O2

lf_lifo * lf_lifo_push(lf_lifo *head,void *elem)

{
  void *pvVar1;
  void *pvVar2;
  void *__e;
  
  if ((long *)((ulong)elem & 0xffffffffffff0000) != (long *)elem) {
    __assert_fail("lf_lifo(elem) == elem",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/lf_lifo.h"
                  ,0x51,"struct lf_lifo *lf_lifo_push(struct lf_lifo *, void *)");
  }
  do {
    pvVar1 = head->next;
    *(long *)((ulong)elem & 0xffffffffffff0000) = (long)pvVar1;
    LOCK();
    pvVar2 = head->next;
    if (pvVar1 == pvVar2) {
      head->next = (void *)((ulong)((int)pvVar1 + 1U & 0xffff) + (long)elem);
      pvVar2 = pvVar1;
    }
    UNLOCK();
  } while (pvVar1 != pvVar2);
  return head;
}

Assistant:

static inline struct lf_lifo *
lf_lifo_push(struct lf_lifo *head, void *elem)
{
	assert(lf_lifo(elem) == elem); /* Aligned address. */
	do {
		void *tail = head->next;
		lf_lifo(elem)->next = tail;
		void *newhead = (char *)elem +
				((aba_value(tail) + 1) & SMALL_LIFO_ALIGNMENT);
		if (pm_atomic_compare_exchange_weak(&head->next, &tail, newhead))
			return head;
	} while (true);
}